

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_byte_array_stop_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  cram_external_type cVar1;
  size_t sVar2;
  uchar *puVar3;
  byte *pbVar4;
  long lVar5;
  ulong uVar6;
  cram_encoding cVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  size_t sVar13;
  size_t sVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  char buf [20];
  byte local_48 [24];
  
  if (prefix == (char *)0x0) {
    iVar15 = 0;
  }
  else {
    sVar2 = strlen(prefix);
    uVar6 = b->alloc;
    sVar14 = b->byte;
    if (uVar6 <= sVar14 + sVar2) {
      do {
        auVar16._8_4_ = (int)(uVar6 >> 0x20);
        auVar16._0_8_ = uVar6;
        auVar16._12_4_ = 0x45300000;
        dVar18 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) * 1.5;
        uVar8 = (ulong)dVar18;
        sVar13 = (long)(dVar18 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
        if (uVar6 == 0) {
          sVar13 = 0x400;
        }
        b->alloc = sVar13;
        puVar3 = (uchar *)realloc(b->data,sVar13);
        b->data = puVar3;
        uVar6 = b->alloc;
        sVar14 = b->byte;
      } while (uVar6 <= sVar14 + sVar2);
    }
    memcpy(b->data + sVar14,prefix,sVar2);
    b->byte = b->byte + sVar2;
    iVar15 = (int)sVar2;
  }
  cVar7 = c->codec;
  if (cVar7 < 0x80) {
    pbVar4 = local_48 + 1;
  }
  else {
    bVar12 = (byte)(cVar7 >> 8);
    if (cVar7 < 0x4000) {
      pbVar4 = local_48 + 2;
      local_48[0] = bVar12 | 0x80;
    }
    else {
      local_48[1] = (byte)(cVar7 >> 0x10);
      if (cVar7 < 0x200000) {
        pbVar4 = local_48 + 3;
        local_48[0] = local_48[1] | 0xc0;
        local_48[1] = bVar12;
      }
      else {
        local_48[0] = (byte)(cVar7 >> 0x18);
        if (cVar7 < 0x10000000) {
          pbVar4 = local_48 + 4;
          local_48[0] = local_48[0] | 0xe0;
          local_48[2] = bVar12;
        }
        else {
          pbVar4 = local_48 + 5;
          local_48[0] = local_48[0] >> 4 | 0xf0;
          local_48[1] = (byte)(cVar7 >> 0x14);
          local_48[2] = (byte)(cVar7 >> 0xc);
          local_48[3] = (byte)(cVar7 >> 4);
          cVar7 = (cram_encoding)((byte)cVar7 & 0xf);
        }
      }
    }
  }
  pbVar4[-1] = (byte)cVar7;
  if ((version & 0xffffff00U) == 0x100) {
    *pbVar4 = 5;
    pbVar4[1] = (c->field_6).byte_array_stop.stop;
    *(cram_external_type *)(pbVar4 + 2) = (c->field_6).external.type;
    pbVar4 = pbVar4 + 6;
  }
  else {
    cVar1 = (c->field_6).external.type;
    bVar12 = 4;
    if (cVar1 < 0x4000) {
      bVar12 = cVar1 < 0x80 ^ 3;
    }
    bVar9 = 6 - (cVar1 < 0x10000000);
    if (cVar1 < 0x200000) {
      bVar9 = bVar12;
    }
    *pbVar4 = bVar9;
    pbVar4[1] = (c->field_6).byte_array_stop.stop;
    bVar12 = (byte)cVar1;
    if (cVar1 < 0x80) {
      pbVar4[2] = bVar12;
      lVar5 = 1;
    }
    else {
      bVar9 = (byte)(cVar1 >> 8);
      if (cVar1 < 0x4000) {
        pbVar4[2] = bVar9 | 0x80;
        pbVar4[3] = bVar12;
        lVar5 = 2;
      }
      else {
        bVar10 = (byte)(cVar1 >> 0x10);
        if (cVar1 < 0x200000) {
          pbVar4[2] = bVar10 | 0xc0;
          pbVar4[3] = bVar9;
          pbVar4[4] = bVar12;
          lVar5 = 3;
        }
        else {
          bVar11 = (byte)(cVar1 >> 0x18);
          if (cVar1 < 0x10000000) {
            pbVar4[2] = bVar11 | 0xe0;
            pbVar4[3] = bVar10;
            pbVar4[4] = bVar9;
            pbVar4[5] = bVar12;
            lVar5 = 4;
          }
          else {
            pbVar4[2] = bVar11 >> 4 | 0xf0;
            pbVar4[3] = (byte)(cVar1 >> 0x14);
            pbVar4[4] = (byte)(cVar1 >> 0xc);
            pbVar4[5] = (byte)(cVar1 >> 4);
            pbVar4[6] = bVar12 & 0xf;
            lVar5 = 5;
          }
        }
      }
    }
    pbVar4 = pbVar4 + 2 + lVar5;
  }
  sVar2 = (long)pbVar4 - (long)local_48;
  uVar6 = b->alloc;
  sVar14 = b->byte;
  if (uVar6 <= sVar14 + sVar2) {
    do {
      auVar17._8_4_ = (int)(uVar6 >> 0x20);
      auVar17._0_8_ = uVar6;
      auVar17._12_4_ = 0x45300000;
      dVar18 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) * 1.5;
      uVar8 = (ulong)dVar18;
      sVar13 = (long)(dVar18 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
      if (uVar6 == 0) {
        sVar13 = 0x400;
      }
      b->alloc = sVar13;
      puVar3 = (uchar *)realloc(b->data,sVar13);
      b->data = puVar3;
      uVar6 = b->alloc;
      sVar14 = b->byte;
    } while (uVar6 <= sVar14 + sVar2);
  }
  memcpy(b->data + sVar14,local_48,sVar2);
  b->byte = b->byte + sVar2;
  return (int)sVar2 + iVar15;
}

Assistant:

int cram_byte_array_stop_encode_store(cram_codec *c, cram_block *b,
				      char *prefix, int version) {
    int len = 0;
    char buf[20], *cp = buf;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    cp += itf8_put(cp, c->codec);

    if (CRAM_MAJOR_VERS(version) == 1) {
	cp += itf8_put(cp, 5);
	*cp++ = c->e_byte_array_stop.stop;
	*cp++ = (c->e_byte_array_stop.content_id >>  0) & 0xff;
	*cp++ = (c->e_byte_array_stop.content_id >>  8) & 0xff;
	*cp++ = (c->e_byte_array_stop.content_id >> 16) & 0xff;
	*cp++ = (c->e_byte_array_stop.content_id >> 24) & 0xff;
    } else {
	cp += itf8_put(cp, 1 + itf8_size(c->e_byte_array_stop.content_id));
	*cp++ = c->e_byte_array_stop.stop;
	cp += itf8_put(cp, c->e_byte_array_stop.content_id);
    }

    BLOCK_APPEND(b, buf, cp-buf);
    len += cp-buf;

    return len;
}